

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.cpp
# Opt level: O0

void hta::storage::file::check(path *dir,bool fast)

{
  bool bVar1;
  ostream *poVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  size_type sVar4;
  Header *pHVar5;
  rep rVar6;
  void *this;
  size_t in_RCX;
  char *local_730;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_6f0 [2];
  duration local_6e0;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_6d8 [3];
  undefined1 local_6c0 [8];
  File<hta::storage::file::Metric::Header,_hta::TimeAggregate> hta_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  path local_400;
  undefined1 local_3d8 [8];
  path hta_path;
  Duration interval;
  Header header;
  fpos<__mbstate_t> local_350;
  ssize_t local_340;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_330;
  TimePoint raw_end;
  __mbstate_t local_320;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_308;
  TimePoint raw_epoch;
  undefined1 local_2f8 [8];
  File<hta::storage::file::Metric::Header,_hta::TimeValue> raw_file;
  path local_68;
  undefined1 local_40 [8];
  path raw_path;
  bool fast_local;
  path *dir_local;
  
  raw_path._39_1_ = fast;
  poVar2 = std::operator<<((ostream *)&std::cout,"[");
  pbVar3 = std::filesystem::__cxx11::operator<<(poVar2,dir);
  poVar2 = std::operator<<(pbVar3,"] Checking metric directory ");
  if ((raw_path._39_1_ & 1) == 0) {
    local_730 = " full";
  }
  else {
    local_730 = " fast";
  }
  poVar2 = std::operator<<(poVar2,local_730);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::filesystem::__cxx11::path::path<char[8],std::filesystem::__cxx11::path>
            (&local_68,(char (*) [8])"raw.hta",auto_format);
  std::filesystem::__cxx11::operator/((path *)local_40,dir,&local_68);
  std::filesystem::__cxx11::path::~path(&local_68);
  poVar2 = std::operator<<((ostream *)&std::cout,"[");
  pbVar3 = std::filesystem::__cxx11::operator<<(poVar2,(path *)local_40);
  poVar2 = std::operator<<(pbVar3,"] Checking raw file");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  File<hta::storage::file::Metric::Header,_hta::TimeValue>::File
            ((File<hta::storage::file::Metric::Header,_hta::TimeValue> *)local_2f8,local_40);
  sVar4 = File<hta::storage::file::Metric::Header,_hta::TimeValue>::size
                    ((File<hta::storage::file::Metric::Header,_hta::TimeValue> *)local_2f8);
  if (sVar4 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"[");
    pbVar3 = std::filesystem::__cxx11::operator<<(poVar2,(path *)local_40);
    poVar2 = std::operator<<(pbVar3,"] Warning: empty raw file, aborting check.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    raw_epoch.
    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r
    ._0_4_ = 1;
  }
  else {
    std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)&raw_end,0);
    local_308.__d.__r =
         (duration)
         File<hta::storage::file::Metric::Header,_hta::TimeValue>::read
                   ((File<hta::storage::file::Metric::Header,_hta::TimeValue> *)local_2f8,
                    (int)raw_end.
                         super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         .__d.__r,(void *)local_320,in_RCX);
    sVar4 = File<hta::storage::file::Metric::Header,_hta::TimeValue>::size
                      ((File<hta::storage::file::Metric::Header,_hta::TimeValue> *)local_2f8);
    std::fpos<__mbstate_t>::fpos(&local_350,sVar4 - 1);
    local_340 = File<hta::storage::file::Metric::Header,_hta::TimeValue>::read
                          ((File<hta::storage::file::Metric::Header,_hta::TimeValue> *)local_2f8,
                           (int)local_350._M_off,(void *)local_350._M_state,in_RCX);
    local_330.__d.__r = (duration)(duration)local_340;
    bVar1 = std::chrono::operator>(&local_308,&local_330);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"[");
      pbVar3 = std::filesystem::__cxx11::operator<<(poVar2,(path *)local_40);
      poVar2 = std::operator<<(pbVar3,"] Error: First after last raw timestamp: ");
      poVar2 = operator<<(poVar2,(TimePoint)local_308.__d.__r);
      poVar2 = std::operator<<(poVar2,", ");
      poVar2 = operator<<(poVar2,(TimePoint)local_330.__d.__r);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::chrono::operator<
                      (&local_308,
                       &genesis.
                        super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      );
    if ((bVar1) ||
       (bVar1 = std::chrono::operator>
                          (&local_308,
                           &future.
                            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          ), bVar1)) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"[");
      pbVar3 = std::filesystem::__cxx11::operator<<(poVar2,(path *)local_40);
      poVar2 = std::operator<<(pbVar3,"] Error: Implausible first raw timestamp: ");
      poVar2 = operator<<(poVar2,(TimePoint)local_308.__d.__r);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    bVar1 = std::chrono::operator<
                      (&local_330,
                       &genesis.
                        super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      );
    if ((bVar1) ||
       (bVar1 = std::chrono::operator>
                          (&local_330,
                           &future.
                            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          ), bVar1)) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"[");
      pbVar3 = std::filesystem::__cxx11::operator<<(poVar2,(path *)local_40);
      poVar2 = std::operator<<(pbVar3,"] Error: Implausible last raw timestamp: ");
      header.interval_max = (int64_t)local_330.__d.__r;
      poVar2 = operator<<(poVar2,(TimePoint)local_330.__d.__r);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    pHVar5 = File<hta::storage::file::Metric::Header,_hta::TimeValue>::header
                       ((File<hta::storage::file::Metric::Header,_hta::TimeValue> *)local_2f8);
    header.interval_factor = pHVar5->interval_max;
    header.version = pHVar5->interval;
    header.interval = (pHVar5->duration_period).num;
    header.duration_period.num = (pHVar5->duration_period).den;
    header.duration_period.den = pHVar5->interval_min;
    header.interval_min = pHVar5->interval_factor;
    check_raw((File<hta::storage::file::Metric::Header,_hta::TimeValue> *)local_2f8,
              (bool)(raw_path._39_1_ & 1));
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,void>
              ((duration<long,std::ratio<1l,1000000000l>> *)&hta_path._M_cmpts,
               (long *)&header.duration_period.den);
    while (rVar6 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                             ((duration<long,_std::ratio<1L,_1000000000L>_> *)&hta_path._M_cmpts),
          rVar6 <= header.interval_factor) {
      rVar6 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                        ((duration<long,_std::ratio<1L,_1000000000L>_> *)&hta_path._M_cmpts);
      std::__cxx11::to_string((string *)&hta_file.header_.interval_max,rVar6);
      std::operator+(&local_420,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &hta_file.header_.interval_max,".hta");
      std::filesystem::__cxx11::path::path(&local_400,&local_420,auto_format);
      std::filesystem::__cxx11::operator/((path *)local_3d8,dir,&local_400);
      std::filesystem::__cxx11::path::~path(&local_400);
      std::__cxx11::string::~string((string *)&local_420);
      std::__cxx11::string::~string((string *)&hta_file.header_.interval_max);
      poVar2 = std::operator<<((ostream *)&std::cout,"[");
      pbVar3 = std::filesystem::__cxx11::operator<<(poVar2,(path *)local_3d8);
      poVar2 = std::operator<<(pbVar3,"] Checking HTA file");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::File
                ((File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *)local_6c0,local_3d8
                );
      rVar6 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                        ((duration<long,_std::ratio<1L,_1000000000L>_> *)&hta_path._M_cmpts);
      pHVar5 = File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::header
                         ((File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *)local_6c0)
      ;
      if (rVar6 != pHVar5->interval) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"[");
        pbVar3 = std::filesystem::__cxx11::operator<<(poVar2,(path *)local_3d8);
        poVar2 = std::operator<<(pbVar3,"] Error: ");
        poVar2 = std::operator<<(poVar2," mismatching interval: name: ");
        local_6d8[1].__d.__r = (duration)(duration)hta_path._32_8_;
        poVar2 = std::operator<<(poVar2,(Duration)hta_path._32_8_);
        poVar2 = std::operator<<(poVar2,", header: ");
        pHVar5 = File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::header
                           ((File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *)
                            local_6c0);
        this = (void *)std::ostream::operator<<(poVar2,pHVar5->interval);
        std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      }
      local_6e0 = local_308.__d.__r;
      local_6f0[1].__d.__r = (duration)(duration)hta_path._32_8_;
      local_6d8[0].__d.__r =
           (duration)interval_begin((TimePoint)local_308.__d.__r,(Duration)hta_path._32_8_);
      local_6f0[0].__d.__r =
           (duration)interval_begin((TimePoint)local_330.__d.__r,(Duration)hta_path._32_8_);
      bVar1 = std::chrono::operator==(local_6d8,local_6f0);
      if (bVar1) {
        sVar4 = File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::size
                          ((File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *)local_6c0
                          );
        if (sVar4 != 0) {
          poVar2 = std::operator<<((ostream *)&std::cerr,
                                   "Top HTA file should be empty but it is not.");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        }
        raw_epoch.
        super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d
        .__r._0_4_ = 2;
      }
      else {
        check_hta((File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *)local_6c0,
                  (Duration)hta_path._32_8_,(TimePoint)local_308.__d.__r,
                  (TimePoint)local_330.__d.__r,(bool)(raw_path._39_1_ & 1));
        raw_epoch.
        super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d
        .__r._0_4_ = 0;
      }
      File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::~File
                ((File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *)local_6c0);
      std::filesystem::__cxx11::path::~path((path *)local_3d8);
      if ((int)raw_epoch.
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r != 0) break;
      std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator*=
                ((duration<long,_std::ratio<1L,_1000000000L>_> *)&hta_path._M_cmpts,
                 &header.interval_min);
    }
    raw_epoch.
    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r
    ._0_4_ = 0;
  }
  File<hta::storage::file::Metric::Header,_hta::TimeValue>::~File
            ((File<hta::storage::file::Metric::Header,_hta::TimeValue> *)local_2f8);
  std::filesystem::__cxx11::path::~path((path *)local_40);
  return;
}

Assistant:

void check(const std::filesystem::path dir, bool fast = false)
{
    std::cout << "[" << dir << "] Checking metric directory " << (fast ? " fast" : " full")
              << std::endl;

    auto raw_path = dir / std::filesystem::path("raw.hta");
    std::cout << "[" << raw_path << "] Checking raw file" << std::endl;
    File<Metric::Header, TimeValue> raw_file{ FileOpenTag::Read(), raw_path };

    if (raw_file.size() == 0)
    {
        std::cout << "[" << raw_path << "] Warning: empty raw file, aborting check." << std::endl;
        return;
    }
    auto raw_epoch = raw_file.read(0).time;
    auto raw_end = raw_file.read(raw_file.size() - 1).time;

    if (raw_epoch > raw_end)
    {
        std::cerr << "[" << raw_path << "] Error: First after last raw timestamp: " << raw_epoch
                  << ", " << raw_end << std::endl;
    }

    if (raw_epoch < genesis || raw_epoch > future)
    {
        std::cerr << "[" << raw_path << "] Error: Implausible first raw timestamp: " << raw_epoch
                  << std::endl;
    }

    if (raw_end < genesis || raw_end > future)
    {
        std::cerr << "[" << raw_path << "] Error: Implausible last raw timestamp: " << raw_end
                  << std::endl;
    }

    auto header = raw_file.header();
    check_raw(raw_file, fast);

    for (auto interval = Duration(header.interval_min); interval.count() <= header.interval_max;
         interval *= header.interval_factor)
    {

        auto hta_path = dir / (std::to_string(interval.count()) + ".hta");
        std::cout << "[" << hta_path << "] Checking HTA file" << std::endl;
        File<Metric::Header, TimeAggregate> hta_file{ FileOpenTag::Read(), hta_path };
        if (interval.count() != hta_file.header().interval)
        {
            std::cerr << "[" << hta_path << "] Error: "
                      << " mismatching interval: name: " << interval
                      << ", header: " << hta_file.header().interval << std::endl;
        }

        if (interval_begin(raw_epoch, interval) == interval_begin(raw_end, interval))
        {
            if (hta_file.size() != 0)
            {
                std::cerr << "Top HTA file should be empty but it is not." << std::endl;
            }
            break;
        }

        // TODO Check interval factor/min
        check_hta(hta_file, interval, raw_epoch, raw_end, fast);
    }
}